

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_io.cpp
# Opt level: O3

bool __thiscall ON_BrepFaceArray::Read(ON_BrepFaceArray *this,ON_BinaryArchive *file)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  ON_BrepFace *pOVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  bool bHavePerFaceColors;
  int count;
  ON_Color per_face_color;
  int minor_version;
  int major_version;
  ON__UINT32 tcode;
  ON__INT64 length_TCODE_ANONYMOUS_CHUNK;
  bool local_55;
  ON__INT32 local_54;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_50;
  int local_4c;
  int local_48;
  uint local_44;
  long local_40;
  ON__INT64 local_38;
  
  ON_ClassArray<ON_BrepFace>::Empty((ON_ClassArray<ON_BrepFace> *)this);
  local_44 = 0;
  local_38 = 0;
  local_54 = 0;
  local_48 = 0;
  local_4c = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmBigChunk(file,&local_44,&local_38);
  if (!bVar1) {
    return false;
  }
  if (local_44 == 0x40008000) {
    bVar1 = ON_BinaryArchive::Read3dmChunkVersion(file,&local_48,&local_4c);
    bVar2 = 0;
    if ((!bVar1) || (local_48 != 1)) goto LAB_0040535a;
    bVar2 = ON_BinaryArchive::ReadInt(file,&local_54);
    ON_ClassArray<ON_BrepFace>::SetCapacity((ON_ClassArray<ON_BrepFace> *)this,(long)local_54);
    if (0 < local_54 && (bool)bVar2) {
      iVar8 = 1;
      do {
        pOVar6 = ON_ClassArray<ON_BrepFace>::AppendNew((ON_ClassArray<ON_BrepFace> *)this);
        iVar3 = (*(pOVar6->super_ON_SurfaceProxy).super_ON_Surface.super_ON_Geometry.super_ON_Object
                  ._vptr_ON_Object[0xb])(pOVar6,file);
        bVar2 = (byte)iVar3;
        if (bVar2 == 0) break;
        bVar1 = iVar8 < local_54;
        iVar8 = iVar8 + 1;
      } while (bVar1);
    }
    if (local_4c < 1) goto LAB_0040535a;
    if (bVar2 == 1 && 0 < local_54) {
      lVar9 = 0x54;
      lVar7 = 1;
      do {
        bVar2 = ON_BinaryArchive::ReadUuid
                          (file,(ON_UUID *)
                                ((((this->super_ON_ObjectArray<ON_BrepFace>).
                                   super_ON_ClassArray<ON_BrepFace>.m_a)->m_face_uuid).Data4 +
                                lVar9 + -0x5c));
        if (local_54 <= lVar7) break;
        lVar9 = lVar9 + 0xd8;
        lVar7 = lVar7 + 1;
      } while ((bool)bVar2);
    }
    if ((bVar2 == 0) || (local_4c < 2)) goto LAB_0040535a;
    local_55 = false;
    bVar1 = ON_BinaryArchive::ReadBool(file,&local_55);
    if (bVar1) {
      bVar2 = 1;
      if ((local_55 == true) && (0 < local_54)) {
        local_40 = 0;
        lVar7 = 0;
        do {
          local_50 = ON_Color::UnsetColor.field_0;
          bVar1 = ON_BinaryArchive::ReadColor(file,(ON_Color *)&local_50);
          if (!bVar1) goto LAB_00405358;
          uVar4 = ON_Color::operator_cast_to_unsigned_int(&ON_Color::UnsetColor);
          uVar5 = ON_Color::operator_cast_to_unsigned_int((ON_Color *)&local_50);
          lVar9 = local_40;
          if (uVar4 != uVar5) {
            ON_BrepFace::SetPerFaceColor
                      ((ON_BrepFace *)
                       ((((this->super_ON_ObjectArray<ON_BrepFace>).super_ON_ClassArray<ON_BrepFace>
                         .m_a)->m_face_uuid).Data4 + local_40 + -0x5c),(ON_Color)local_50);
          }
          lVar7 = lVar7 + 1;
          local_40 = lVar9 + 0xd8;
        } while (lVar7 < local_54);
      }
      goto LAB_0040535a;
    }
  }
LAB_00405358:
  bVar2 = 0;
LAB_0040535a:
  bVar1 = ON_BinaryArchive::EndRead3dmChunk(file);
  return (bool)(bVar1 & bVar2);
}

Assistant:

bool ON_BrepFaceArray::Read( ON_BinaryArchive& file )
{
  Empty();
  ON__UINT32 tcode = 0;
  ON__INT64 length_TCODE_ANONYMOUS_CHUNK = 0;
  int count = 0;
  int i;
  int major_version = 0;
  int minor_version = 0;
  bool rc = file.BeginRead3dmBigChunk( &tcode, &length_TCODE_ANONYMOUS_CHUNK );
  if (rc) {
    if (tcode != TCODE_ANONYMOUS_CHUNK)
      rc = false;
    if (rc) rc = file.Read3dmChunkVersion(&major_version,&minor_version);
    if (rc) {
      if ( major_version==1 ) 
      {
        if (rc) rc = file.ReadInt(&count);
        SetCapacity(count);
        for ( i = 0; i < count && rc ; i++ ) 
        {
          ON_BrepFace& face = AppendNew();
          rc = face.Read(file)?true:false;
        }    

        if ( minor_version >= 1 )
        {
          // chunk version 1.1 and later has face uuids
          for ( i = 0; i < count && rc; i++ )
          {
            rc = file.ReadUuid( m_a[i].m_face_uuid );
          }

          if (rc && minor_version >= 2)
          {
            // chunk version 1.2 and later has per face colors
            bool bHavePerFaceColors = false;
            rc = file.ReadBool(&bHavePerFaceColors);
            if (rc && bHavePerFaceColors)
            {
              for (i = 0; rc && i < count; i++)
              {
                ON_Color per_face_color = ON_Color::UnsetColor;
                rc = file.ReadColor(per_face_color);
                if (rc && ON_Color::UnsetColor != per_face_color)
                  m_a[i].SetPerFaceColor(per_face_color);
              }
            }
          }
        }
      }
      else 
      {
        rc = 0;
      }
    }
    if ( !file.EndRead3dmChunk() )
      rc = false;
  }
  return rc;
}